

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpUtils.h
# Opt level: O0

int gethtmltagdata(char *str,char *tag,char **pTagParams,char **pTagData)

{
  size_t sVar1;
  char *__dest;
  char *pcVar2;
  void *pvVar3;
  char *tagend;
  char *tagbegin;
  char *pcStack_40;
  int count;
  char *ptr2;
  char *ptr;
  char **pTagData_local;
  char **pTagParams_local;
  char *tag_local;
  char *str_local;
  
  ptr2 = (char *)0x0;
  pcStack_40 = (char *)0x0;
  tagbegin._4_4_ = 0;
  ptr = (char *)pTagData;
  pTagData_local = pTagParams;
  pTagParams_local = (char **)tag;
  tag_local = str;
  sVar1 = strlen(tag);
  __dest = (char *)calloc(sVar1 + 2,1);
  if (__dest == (char *)0x0) {
    str_local._4_4_ = 6;
  }
  else {
    *__dest = '<';
    strcat(__dest,(char *)pTagParams_local);
    pcVar2 = stristrbeginend(tag_local,__dest,">",&ptr2,(int *)((long)&tagbegin + 4));
    if (pcVar2 == (char *)0x0) {
      free(__dest);
      str_local._4_4_ = 4;
    }
    else {
      pcVar2 = (char *)calloc((long)(tagbegin._4_4_ + 1),1);
      *pTagData_local = pcVar2;
      if (*pTagData_local == (char *)0x0) {
        free(__dest);
        str_local._4_4_ = 6;
      }
      else {
        memcpy(*pTagData_local,ptr2,(long)tagbegin._4_4_);
        sVar1 = strlen((char *)pTagParams_local);
        pcVar2 = (char *)calloc(sVar1 + 4,1);
        if (pcVar2 == (char *)0x0) {
          free(*pTagData_local);
          free(__dest);
          str_local._4_4_ = 6;
        }
        else {
          *pcVar2 = '<';
          pcVar2[1] = '/';
          strcat(pcVar2,(char *)pTagParams_local);
          strcat(pcVar2,">");
          pcStack_40 = stristr(tag_local,pcVar2);
          if (pcStack_40 == (char *)0x0) {
            free(pcVar2);
            free(*pTagData_local);
            free(__dest);
            str_local._4_4_ = 4;
          }
          else {
            tagbegin._4_4_ = (int)pcStack_40 - (int)ptr2;
            if (tagbegin._4_4_ < 0) {
              free(pcVar2);
              free(*pTagData_local);
              free(__dest);
              str_local._4_4_ = 4;
            }
            else {
              pvVar3 = calloc((long)(tagbegin._4_4_ + 1),1);
              *(void **)ptr = pvVar3;
              if (*(long *)ptr == 0) {
                free(pcVar2);
                free(*pTagData_local);
                free(__dest);
                str_local._4_4_ = 6;
              }
              else {
                memcpy(*(void **)ptr,pcStack_40,(long)tagbegin._4_4_);
                free(pcVar2);
                free(__dest);
                str_local._4_4_ = 0;
              }
            }
          }
        }
      }
    }
  }
  return str_local._4_4_;
}

Assistant:

inline int gethtmltagdata(char* str, char* tag, char** pTagParams, char** pTagData)
{
	char* ptr = NULL;
	char* ptr2 = NULL;
	int count = 0;
	char* tagbegin = NULL;
	char* tagend = NULL;

	tagbegin = (char*)calloc(strlen(tag)+2, 1);
	if (tagbegin == NULL)
	{
		return EXIT_OUT_OF_MEMORY;
	}

	tagbegin[0] = '<';
	strcat(tagbegin, tag);

	if (stristrbeginend(str, tagbegin, ">", &ptr, &count) == NULL)
	{
		free(tagbegin);
		return EXIT_INVALID_DATA;
	}

	*pTagParams = (char*)calloc(count+1, 1);
	if (*pTagParams == NULL)
	{
		free(tagbegin);
		return EXIT_OUT_OF_MEMORY;
	}
	
	memcpy(*pTagParams, ptr, count);

	tagend = (char*)calloc(strlen(tag)+4, 1);
	if (tagend == NULL)
	{
		free(*pTagParams);
		free(tagbegin);
		return EXIT_OUT_OF_MEMORY;
	}

	tagend[0] = '<';
	tagend[1] = '/';
	strcat(tagend, tag);
	strcat(tagend, ">");

	ptr2 = stristr(str, tagend);
	if (ptr2 == NULL)
	{
		free(tagend);
		free(*pTagParams);
		free(tagbegin);
		return EXIT_INVALID_DATA;
	}

	count = (int)(ptr2-ptr);
	if (count < 0)
	{
		free(tagend);
		free(*pTagParams);
		free(tagbegin);
		return EXIT_INVALID_DATA;
	}

	*pTagData = (char*)calloc(count+1, 1);
	if (*pTagData == NULL)
	{
		free(tagend);
		free(*pTagParams);
		free(tagbegin);
		return EXIT_OUT_OF_MEMORY;
	}
	
	memcpy(*pTagData, ptr2, count);

	free(tagend);
	free(tagbegin);

	return EXIT_SUCCESS;
}